

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O1

string * chooseMap_abi_cxx11_(void)

{
  pointer pcVar1;
  pointer pbVar2;
  int iVar3;
  pointer this;
  ostream *poVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer p_Var5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  ulong uVar6;
  string *in_RDI;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *map;
  pointer pbVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  uint mapChoice;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string *local_118;
  directory_iterator local_110;
  directory_iterator local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  path local_d0;
  path local_90;
  long *local_50 [2];
  long local_40 [2];
  
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::experimental::filesystem::v1::current_path_abi_cxx11_((v1 *)&local_90);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            (&local_100,&local_90,none,(error_code *)0x0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
  if (local_100._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_100._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 8) =
           *(int *)(local_100._M_dir.
                    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_100._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 8) =
           *(int *)(local_100._M_dir.
                    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 8) + 1;
    }
  }
  local_110._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_100._M_dir.
           super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_110._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_100._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_100._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_100._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 8) =
           *(int *)(local_100._M_dir.
                    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_100._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 8) =
           *(int *)(local_100._M_dir.
                    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 8) + 1;
    }
    if (local_100._M_dir.
        super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100._M_dir.
                 super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  local_118 = in_RDI;
  while (local_110._M_dir.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this = (pointer)std::experimental::filesystem::v1::__cxx11::directory_iterator::operator*
                              (&local_110);
    auVar12 = std::experimental::filesystem::v1::__cxx11::path::_M_find_extension((path *)this);
    bVar9 = auVar12._0_8_ == 0;
    bVar10 = auVar12._8_8_ == -1;
    if (bVar10 || bVar9) {
      bVar11 = false;
    }
    else {
      auVar12 = std::experimental::filesystem::v1::__cxx11::path::_M_find_extension((path *)this);
      if (auVar12._8_8_ == -1 || auVar12._0_8_ == 0) {
        local_90._M_pathname._M_dataplus._M_p = (pointer)&local_90._M_pathname.field_2;
        local_90._M_pathname._M_string_length = 0;
        local_90._M_pathname.field_2._M_local_buf[0] = '\0';
        local_90._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_90._49_8_ = 0;
        local_90._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_90._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_90._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_d0,auVar12._0_8_);
        std::experimental::filesystem::v1::__cxx11::path::path(&local_90,&local_d0._M_pathname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_pathname._M_dataplus._M_p != &local_d0._M_pathname.field_2) {
          operator_delete(local_d0._M_pathname._M_dataplus._M_p,
                          CONCAT71(local_d0._M_pathname.field_2._M_allocated_capacity._1_7_,
                                   local_d0._M_pathname.field_2._M_local_buf[0]) + 1);
        }
      }
      local_50[0] = local_40;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_50,local_90._M_pathname._M_dataplus._M_p,
                 local_90._M_pathname._M_dataplus._M_p + local_90._M_pathname._M_string_length);
      iVar3 = std::__cxx11::string::compare((char *)local_50);
      bVar11 = iVar3 == 0;
    }
    if (!bVar10 && !bVar9) {
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
    }
    in_RDI = local_118;
    if (bVar11) {
      if ((this->super_path)._M_pathname._M_string_length == 0) {
        local_d0._M_pathname._M_dataplus._M_p = (pointer)&local_d0._M_pathname.field_2;
        local_d0._M_pathname._M_string_length = 0;
        local_d0._M_pathname.field_2._M_local_buf[0] = '\0';
        local_d0._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_d0._49_8_ = 0;
        local_d0._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d0._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_d0._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      }
      else {
        if (*(_Type *)((_List *)(&(this->super_path)._M_pathname + 1) + 1) == _Multi) {
          p_Var5 = (((_List *)(&(this->super_path)._M_pathname + 1))->
                   super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          p_Var5 = (pointer)0x0;
        }
        if (*(_Type *)((_List *)(&(this->super_path)._M_pathname + 1) + 1) == _Multi) {
          this = p_Var5 + -1;
        }
        std::experimental::filesystem::v1::__cxx11::path::path(&local_d0,&this->super_path);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_d0._M_pathname._M_dataplus._M_p,
                 local_d0._M_pathname._M_dataplus._M_p + local_d0._M_pathname._M_string_length);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                 &local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      std::experimental::filesystem::v1::__cxx11::path::~path(&local_d0);
    }
    std::experimental::filesystem::v1::__cxx11::directory_iterator::operator++(&local_110);
  }
  if (local_100._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"");
  }
  else {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nplease choose a map :\n",0x17);
      pbVar2 = local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar7 = 0;
      for (pbVar8 = local_138.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1
          ) {
        uVar7 = uVar7 + 1;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
      std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
      std::istream::ignore((long)&std::cin,0x200);
      uVar6 = (ulong)((int)local_d0._M_pathname._M_dataplus._M_p - 1U);
    } while (uVar7 <= (int)local_d0._M_pathname._M_dataplus._M_p - 1U);
    if ((ulong)((long)local_138.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_138.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    (local_118->_M_dataplus)._M_p = (pointer)&local_118->field_2;
    pcVar1 = local_138.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,pcVar1,
               pcVar1 + local_138.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_string_length);
    in_RDI = local_118;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  return in_RDI;
}

Assistant:

static std::string chooseMap() {
    vector<std::string> mapList = vector<std::string>();
    for (const auto& entry : fs::directory_iterator(fs::current_path())) {
        if (entry.path().has_extension() && entry.path().extension().string() == ".map") {
            mapList.push_back(entry.path().filename());
        }
    }
    if (!mapList.empty()) {
        unsigned int mapChoice;
        unsigned int numberMaps;
        do {
            cout << "\nplease choose a map :\n";
            numberMaps = 0;
            for (const auto& map : mapList) {
                numberMaps++;
                cout << numberMaps << " - " << map << "\n";
            }
            cin >> mapChoice;
            cin.clear();
            cin.ignore(512, '\n');
        } while (mapChoice < 1 || mapChoice > numberMaps || isnan(mapChoice));
        return std::string(mapList.at(mapChoice - 1));
    }
    return "";
}